

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryBackgroundBorder.cpp
# Opt level: O1

void __thiscall
Rml::GeometryBackgroundBorder::DrawPointPoint
          (GeometryBackgroundBorder *this,Vector2f pos_outer,Vector2f pos_inner,
          ColourbPremultiplied color0,ColourbPremultiplied color1)

{
  vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *this_00;
  bool bVar1;
  
  bVar1 = true;
  if ((color0.red == color1.red) && (color0._1_2_ == color1._1_2_)) {
    bVar1 = 0xffffff < ((uint)color1 ^ (uint)color0);
  }
  this_00 = this->vertices;
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::reserve
            (this_00,(long)(int)((int)((ulong)((long)(this_00->
                                                                                                          
                                                  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this_00->
                                                                                                        
                                                  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 2)
                                 * -0x33333333 + (uint)bVar1 * 2 + 2));
  DrawPoint(this,pos_inner,color0);
  DrawPoint(this,pos_outer,color0);
  if (bVar1 != false) {
    DrawPoint(this,pos_inner,color1);
    DrawPoint(this,pos_outer,color1);
    return;
  }
  return;
}

Assistant:

void GeometryBackgroundBorder::DrawPointPoint(Vector2f pos_outer, Vector2f pos_inner, ColourbPremultiplied color0, ColourbPremultiplied color1)
{
	const bool different_color = (color0 != color1);

	vertices.reserve((int)vertices.size() + (different_color ? 4 : 2));

	DrawPoint(pos_inner, color0);
	DrawPoint(pos_outer, color0);

	if (different_color)
	{
		DrawPoint(pos_inner, color1);
		DrawPoint(pos_outer, color1);
	}
}